

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<std::type_info_const*>
          (BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,type_info **key,_func_bool_type_info_ptr_bool_void_ptr **value)

{
  int iVar1;
  _func_bool_type_info_ptr_bool_void_ptr **pp_Var2;
  int i;
  _func_bool_type_info_ptr_bool_void_ptr **value_local;
  type_info **key_local;
  BaseDictionary<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<std::type_info_const*>(this,key);
  if (-1 < iVar1) {
    pp_Var2 = anon_unknown_4::
              ValueEntry<bool_(*)(const_std::type_info_*,_bool,_void_*),_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*)>_>
              ::Value((ValueEntry<bool_(*)(const_std::type_info_*,_bool,_void_*),_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*)>_>
                       *)(*(long *)(this + 8) + (long)iVar1 * 0x18));
    *value = *pp_Var2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }